

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateIsInitialized
          (MessageGenerator *this,Printer *printer)

{
  FieldDescriptor *this_00;
  pointer ppFVar1;
  MessageSCCAnalyzer *this_01;
  long lVar2;
  bool bVar3;
  FieldDescriptor FVar4;
  FileOptions_OptimizeMode FVar5;
  MessageAnalysis MVar6;
  FieldGenerator *pFVar7;
  Descriptor *pDVar8;
  SCC *scc;
  long lVar9;
  OneofDescriptor *pOVar10;
  pointer ppFVar11;
  Iterator __begin4;
  Iterator __end4;
  Iterator __end4_1;
  Iterator __begin3;
  Formatter format;
  Iterator __end3;
  string local_f0;
  OneofDescriptor *local_d0;
  Printer *local_c8;
  Iterator local_c0;
  FieldDescriptor *local_b0;
  code *local_a8;
  OneofDescriptor *local_a0;
  Iterator local_98;
  Formatter local_88;
  Options *local_50;
  FieldGeneratorMap *local_48;
  Iterator local_40;
  
  pDVar8 = this->descriptor_;
  local_50 = &this->options_;
  local_c8 = printer;
  FVar5 = GetOptimizeFor(*(FileDescriptor **)(pDVar8 + 0x10),local_50,(bool *)0x0);
  if (((FVar5 == FileOptions_OptimizeMode_LITE_RUNTIME) || (*(int *)(pDVar8 + 0x78) != 0)) ||
     (*(int *)(pDVar8 + 4) != 0)) {
    local_88.printer_ = local_c8;
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::_Rb_tree(&local_88.vars_._M_t,&(this->variables_)._M_t);
    Formatter::operator()<>(&local_88,"bool $classname$::IsInitialized() const {\n");
    io::Printer::Indent(local_88.printer_);
    if (0 < *(int *)(this->descriptor_ + 0x78)) {
      Formatter::operator()<>
                (&local_88,"if (!_extensions_.IsInitialized()) {\n  return false;\n}\n\n");
    }
    if (0 < this->num_required_fields_) {
      Formatter::operator()<>
                (&local_88,"if (_Internal::MissingRequiredFields(_has_bits_)) return false;\n");
    }
    ppFVar11 = (this->optimized_order_).
               super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
    ppFVar1 = (this->optimized_order_).
              super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if (ppFVar11 != ppFVar1) {
      do {
        pFVar7 = FieldGeneratorMap::get(&this->field_generators_,*ppFVar11);
        (*pFVar7->_vptr_FieldGenerator[0x15])(pFVar7,local_c8);
        ppFVar11 = ppFVar11 + 1;
      } while (ppFVar11 != ppFVar1);
    }
    if (this->num_weak_fields_ != 0) {
      Formatter::operator()<>(&local_88,"if (!_weak_field_map_.IsInitialized()) return false;\n");
    }
    local_98.descriptor = this->descriptor_;
    local_98.idx = 0;
    local_40.idx = *(int *)(local_98.descriptor + 0x6c);
    local_48 = &this->field_generators_;
    local_40.descriptor = local_98.descriptor;
    while( true ) {
      bVar3 = operator==(&local_98,&local_40);
      if (bVar3) break;
      local_f0._M_string_length = *(long *)(local_98.descriptor + 0x30) + (long)local_98.idx * 0x28;
      local_f0._M_dataplus._M_p = local_f0._M_dataplus._M_p & 0xffffffff00000000;
      local_c0.idx = *(int *)(local_f0._M_string_length + 4);
      local_d0 = (OneofDescriptor *)local_f0._M_string_length;
      local_c0.descriptor = (OneofDescriptor *)local_f0._M_string_length;
LAB_002a89d1:
      bVar3 = operator==((Iterator *)&local_f0,&local_c0);
      if (bVar3) goto LAB_002a8c62;
      this_00 = (FieldDescriptor *)
                (*(long *)(local_f0._M_string_length + 0x20) +
                (long)(int)local_f0._M_dataplus._M_p * 0x48);
      if (*(once_flag **)(this_00 + 0x18) != (once_flag *)0x0) {
        local_a8 = FieldDescriptor::TypeOnceInit;
        local_b0 = this_00;
        std::
        call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                  (*(once_flag **)(this_00 + 0x18),(_func_void_FieldDescriptor_ptr **)&local_a8,
                   &local_b0);
      }
      FVar4 = this_00[2];
      if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)(byte)FVar4 * 4) != 10) {
LAB_002a8acd:
        local_f0._M_dataplus._M_p._0_4_ = (int)local_f0._M_dataplus._M_p + 1;
        goto LAB_002a89d1;
      }
      if ((*(char *)(*(long *)(this_00 + 0x38) + 0x4d) == '\x01') &&
         ((~(byte)this_00[1] & 0x60) != 0)) {
        if (*(once_flag **)(this_00 + 0x18) != (once_flag *)0x0) {
          local_a8 = FieldDescriptor::TypeOnceInit;
          local_b0 = this_00;
          std::
          call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                    (*(once_flag **)(this_00 + 0x18),(_func_void_FieldDescriptor_ptr **)&local_a8,
                     &local_b0);
          FVar4 = this_00[2];
        }
        if (FVar4 == (FieldDescriptor)0xb) {
          FVar5 = GetOptimizeFor(*(FileDescriptor **)(this_00 + 0x10),local_50,(bool *)0x0);
          if ((FVar5 != FileOptions_OptimizeMode_LITE_RUNTIME) &&
             (((this->options_).opensource_runtime & 1U) == 0)) goto LAB_002a8acd;
        }
      }
      this_01 = this->scc_analyzer_;
      pDVar8 = FieldDescriptor::message_type(this_00);
      scc = SCCAnalyzer<google::protobuf::compiler::cpp::MessageSCCAnalyzer::DepsGenerator>::GetSCC
                      (&this_01->analyzer_,pDVar8);
      MVar6 = MessageSCCAnalyzer::GetSCCAnalysis(this_01,scc);
      if (((uint5)MVar6 & 0x1010000) == 0) goto LAB_002a8acd;
      Formatter::operator()
                (&local_88,"switch ($1$_case()) {\n",
                 *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                  (local_d0 + 8));
      io::Printer::Indent(local_88.printer_);
      local_c0.idx = 0;
      local_c0.descriptor = local_d0;
      local_a8 = (code *)CONCAT44(local_a8._4_4_,*(undefined4 *)(local_d0 + 4));
      local_a0 = local_d0;
      while( true ) {
        bVar3 = operator==(&local_c0,(Iterator *)&local_a8);
        if (bVar3) break;
        lVar9 = (long)local_c0.idx;
        lVar2 = *(long *)(local_c0.descriptor + 0x20);
        UnderscoresToCamelCase(&local_f0,*(string **)(lVar2 + 8 + lVar9 * 0x48),true);
        Formatter::operator()(&local_88,"case k$1$: {\n",&local_f0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
          operator_delete(local_f0._M_dataplus._M_p);
        }
        io::Printer::Indent(local_88.printer_);
        pFVar7 = FieldGeneratorMap::get(local_48,(FieldDescriptor *)(lVar2 + lVar9 * 0x48));
        (*pFVar7->_vptr_FieldGenerator[0x15])(pFVar7,local_c8);
        Formatter::operator()<>(&local_88,"break;\n");
        io::Printer::Outdent(local_88.printer_);
        Formatter::operator()<>(&local_88,"}\n");
        local_c0.idx = local_c0.idx + 1;
      }
      local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
      lVar2 = **(long **)(local_d0 + 8);
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_f0,lVar2,(*(long **)(local_d0 + 8))[1] + lVar2);
      if ((OneofDescriptor *)local_f0._M_string_length != (OneofDescriptor *)0x0) {
        pOVar10 = (OneofDescriptor *)0x0;
        do {
          if ((byte)(local_f0._M_dataplus._M_p[(long)pOVar10] + 0x9fU) < 0x1a) {
            local_f0._M_dataplus._M_p[(long)pOVar10] =
                 local_f0._M_dataplus._M_p[(long)pOVar10] + -0x20;
          }
          pOVar10 = pOVar10 + 1;
        } while ((OneofDescriptor *)local_f0._M_string_length != pOVar10);
      }
      Formatter::operator()(&local_88,"case $1$_NOT_SET: {\n  break;\n}\n",&local_f0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
        operator_delete(local_f0._M_dataplus._M_p);
      }
      io::Printer::Outdent(local_88.printer_);
      Formatter::operator()<>(&local_88,"}\n");
LAB_002a8c62:
      local_98.idx = local_98.idx + 1;
    }
    io::Printer::Outdent(local_88.printer_);
    Formatter::operator()<>(&local_88,"  return true;\n}\n");
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&local_88.vars_._M_t);
  }
  return;
}

Assistant:

void MessageGenerator::GenerateIsInitialized(io::Printer* printer) {
  if (HasSimpleBaseClass(descriptor_, options_)) return;
  Formatter format(printer, variables_);
  format("bool $classname$::IsInitialized() const {\n");
  format.Indent();

  if (descriptor_->extension_range_count() > 0) {
    format(
        "if (!_extensions_.IsInitialized()) {\n"
        "  return false;\n"
        "}\n\n");
  }

  if (num_required_fields_ > 0) {
    format(
        "if (_Internal::MissingRequiredFields(_has_bits_))"
        " return false;\n");
  }

  // Now check that all non-oneof embedded messages are initialized.
  for (auto field : optimized_order_) {
    field_generators_.get(field).GenerateIsInitialized(printer);
  }
  if (num_weak_fields_) {
    // For Weak fields.
    format("if (!_weak_field_map_.IsInitialized()) return false;\n");
  }
  // Go through the oneof fields, emitting a switch if any might have required
  // fields.
  for (auto oneof : OneOfRange(descriptor_)) {
    bool has_required_fields = false;
    for (auto field : FieldRange(oneof)) {
      if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE &&
          !ShouldIgnoreRequiredFieldCheck(field, options_) &&
          scc_analyzer_->HasRequiredFields(field->message_type())) {
        has_required_fields = true;
        break;
      }
    }

    if (!has_required_fields) {
      continue;
    }

    format("switch ($1$_case()) {\n", oneof->name());
    format.Indent();
    for (auto field : FieldRange(oneof)) {
      format("case k$1$: {\n", UnderscoresToCamelCase(field->name(), true));
      format.Indent();
      if (!IsFieldStripped(field, options_)) {
        field_generators_.get(field).GenerateIsInitialized(printer);
      }
      format("break;\n");
      format.Outdent();
      format("}\n");
    }
    format(
        "case $1$_NOT_SET: {\n"
        "  break;\n"
        "}\n",
        ToUpper(oneof->name()));
    format.Outdent();
    format("}\n");
  }

  format.Outdent();
  format(
      "  return true;\n"
      "}\n");
}